

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O0

EbmlElement * __thiscall
libebml::EbmlMaster::FindFirstElt(EbmlMaster *this,EbmlCallbacks *Callbacks,bool bCreateIfNull)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  reference ppEVar5;
  undefined4 extraout_var;
  bool local_59;
  EbmlMaster *local_48;
  EbmlElement *NewElt;
  size_t local_38;
  ulong local_30;
  size_t Index;
  EbmlCallbacks *pEStack_20;
  bool bCreateIfNull_local;
  EbmlCallbacks *Callbacks_local;
  EbmlMaster *this_local;
  
  local_30 = 0;
  Index._7_1_ = bCreateIfNull;
  pEStack_20 = Callbacks;
  Callbacks_local = (EbmlCallbacks *)this;
  while( true ) {
    uVar1 = local_30;
    sVar4 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::size
                      (&this->ElementList);
    if (sVar4 <= uVar1) {
      if ((Index._7_1_ & 1) == 0) {
        this_local = (EbmlMaster *)0x0;
      }
      else {
        local_48 = (EbmlMaster *)(*pEStack_20->Create)();
        if (local_48 == (EbmlMaster *)0x0) {
          this_local = (EbmlMaster *)0x0;
        }
        else {
          bVar2 = PushElement(this,(EbmlElement *)local_48);
          if (!bVar2) {
            if (local_48 != (EbmlMaster *)0x0) {
              (*(local_48->super_EbmlElement)._vptr_EbmlElement[1])();
            }
            local_48 = (EbmlMaster *)0x0;
          }
          this_local = local_48;
        }
      }
      return &this_local->super_EbmlElement;
    }
    ppEVar5 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::
              operator[](&this->ElementList,local_30);
    local_59 = false;
    if (*ppEVar5 != (value_type)0x0) {
      ppEVar5 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::
                operator[](&this->ElementList,local_30);
      iVar3 = (*(*ppEVar5)->_vptr_EbmlElement[3])();
      NewElt = *(EbmlElement **)CONCAT44(extraout_var,iVar3);
      local_38 = ((undefined8 *)CONCAT44(extraout_var,iVar3))[1];
      local_59 = EbmlId::operator==((EbmlId *)&NewElt,pEStack_20->GlobalId);
    }
    if (local_59 != false) break;
    local_30 = local_30 + 1;
  }
  ppEVar5 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::operator[]
                      (&this->ElementList,local_30);
  return *ppEVar5;
}

Assistant:

EbmlElement *EbmlMaster::FindFirstElt(const EbmlCallbacks & Callbacks, bool bCreateIfNull)
{
  size_t Index;

  for (Index = 0; Index < ElementList.size(); Index++) {
    if (ElementList[Index] && EbmlId(*(ElementList[Index])) == EBML_INFO_ID(Callbacks))
      return ElementList[Index];
  }

  if (bCreateIfNull) {
    // add the element
    EbmlElement *NewElt = &EBML_INFO_CREATE(Callbacks);
    if (NewElt == NULL)
      return NULL;

    if (!PushElement(*NewElt)) {
      delete NewElt;
      NewElt = NULL;
    }
    return NewElt;
  }

  return NULL;
}